

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VFile.cpp
# Opt level: O0

void __thiscall blc::tools::VFile::seekg(VFile *this,int pos)

{
  ulong uVar1;
  undefined8 uVar2;
  int in_ESI;
  long in_RDI;
  string *in_stack_00000178;
  exception *in_stack_00000180;
  allocator<char> *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  
  uVar1 = std::__cxx11::string::size();
  if (uVar1 < (ulong)(long)in_ESI) {
    uVar2 = __cxa_allocate_exception(0x78);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
    error::exception::exception(in_stack_00000180,in_stack_00000178);
    __cxa_throw(uVar2,&error::exception::typeinfo,error::exception::~exception);
  }
  *(int *)(in_RDI + 0x238) = in_ESI;
  return;
}

Assistant:

void blc::tools::VFile::seekg(const int pos) {
	if (pos > this->_cache.size())
		throw blc::error::exception("Impossible to modify cursor (value to hight)");
	else
		this->_cursor = pos;
}